

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O0

void SimpleLoggerMgr::compressWorker(void)

{
  bool bVar1;
  bool bVar2;
  pthread_t __target_thread;
  SimpleLoggerMgr *pSVar3;
  reference ppCVar4;
  iterator entry;
  lock_guard<std::mutex> l;
  CompElem *elem;
  size_t sub_ms;
  bool sleep_next_time;
  SimpleLoggerMgr *mgr;
  size_t in_stack_000001a8;
  SimpleLogger *in_stack_000001b0;
  SimpleLoggerMgr *in_stack_ffffffffffffffa8;
  list<SimpleLoggerMgr::CompElem_*,_std::allocator<SimpleLoggerMgr::CompElem_*>_>
  *in_stack_ffffffffffffffb0;
  iterator in_stack_ffffffffffffffb8;
  _List_const_iterator<SimpleLoggerMgr::CompElem_*> local_40;
  _Self local_38;
  _Self local_30;
  size_t in_stack_ffffffffffffffd8;
  SimpleLoggerMgr *in_stack_ffffffffffffffe0;
  
  __target_thread = pthread_self();
  pthread_setname_np(__target_thread,"sl_compressor");
  pSVar3 = get();
  bVar1 = true;
  while (bVar2 = chkTermination((SimpleLoggerMgr *)0x14d201), ((bVar2 ^ 0xffU) & 1) != 0) {
    if (bVar1) {
      sleepCompressor(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    }
    bVar1 = true;
    in_stack_ffffffffffffffe0 = (SimpleLoggerMgr *)0x0;
    std::lock_guard<std::mutex>::lock_guard
              ((lock_guard<std::mutex> *)in_stack_ffffffffffffffb0,
               &in_stack_ffffffffffffffa8->loggersLock);
    local_30._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<SimpleLoggerMgr::CompElem_*,_std::allocator<SimpleLoggerMgr::CompElem_*>_>::begin
                   ((list<SimpleLoggerMgr::CompElem_*,_std::allocator<SimpleLoggerMgr::CompElem_*>_>
                     *)in_stack_ffffffffffffffa8);
    local_38._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<SimpleLoggerMgr::CompElem_*,_std::allocator<SimpleLoggerMgr::CompElem_*>_>::end
                   ((list<SimpleLoggerMgr::CompElem_*,_std::allocator<SimpleLoggerMgr::CompElem_*>_>
                     *)in_stack_ffffffffffffffa8);
    bVar2 = std::operator!=(&local_30,&local_38);
    if (bVar2) {
      ppCVar4 = std::_List_iterator<SimpleLoggerMgr::CompElem_*>::operator*
                          ((_List_iterator<SimpleLoggerMgr::CompElem_*> *)0x14d29a);
      in_stack_ffffffffffffffe0 = (SimpleLoggerMgr *)*ppCVar4;
      in_stack_ffffffffffffffb0 = &pSVar3->pendingCompElems;
      std::_List_const_iterator<SimpleLoggerMgr::CompElem_*>::_List_const_iterator
                (&local_40,&local_30);
      in_stack_ffffffffffffffb8 =
           std::__cxx11::
           list<SimpleLoggerMgr::CompElem_*,_std::allocator<SimpleLoggerMgr::CompElem_*>_>::erase
                     (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffb8._M_node);
    }
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x14d2df);
    if (in_stack_ffffffffffffffe0 != (SimpleLoggerMgr *)0x0) {
      in_stack_ffffffffffffffa8 = in_stack_ffffffffffffffe0;
      SimpleLogger::doCompression(in_stack_000001b0,in_stack_000001a8);
      in_stack_ffffffffffffffe0 = in_stack_ffffffffffffffa8;
      if (in_stack_ffffffffffffffa8 != (SimpleLoggerMgr *)0x0) {
        operator_delete(in_stack_ffffffffffffffa8);
      }
      bVar1 = false;
    }
  }
  return;
}

Assistant:

void SimpleLoggerMgr::compressWorker() {
#ifdef __linux__
    pthread_setname_np(pthread_self(), "sl_compressor");
#endif
    SimpleLoggerMgr* mgr = SimpleLoggerMgr::get();
    bool sleep_next_time = true;
    while (!mgr->chkTermination()) {
        // Every 500ms.
        size_t sub_ms = 500;
        if (sleep_next_time) {
            mgr->sleepCompressor(sub_ms);
        }
        sleep_next_time = true;

        CompElem* elem = nullptr;
        {   std::lock_guard<std::mutex> l(mgr->pendingCompElemsLock);
            auto entry = mgr->pendingCompElems.begin();
            if (entry != mgr->pendingCompElems.end()) {
                elem = *entry;
                mgr->pendingCompElems.erase(entry);
            }
        }

        if (elem) {
            elem->targetLogger->doCompression(elem->fileNum);
            delete elem;
            // Continuous compression if pending item exists.
            sleep_next_time = false;
        }
    }
}